

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O0

var * __thiscall cs::runtime_type::parse_access_lhs(runtime_type *this,var *a,var *b)

{
  ulong uVar1;
  bool bVar2;
  numeric *pnVar3;
  ulong uVar4;
  size_type sVar5;
  numeric_integer nVar6;
  size_t sVar7;
  undefined8 uVar8;
  string *str;
  flat_hash_map<cs_impl::any,_cs_impl::any,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
  *map;
  size_t i;
  size_t posit;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *arr;
  numeric *in_stack_fffffffffffffde8;
  runtime_error *in_stack_fffffffffffffdf0;
  runtime_error *this_00;
  type_info *in_stack_fffffffffffffdf8;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
  *in_stack_fffffffffffffe00;
  allocator *paVar9;
  flat_hash_map<cs_impl::any,_cs_impl::any,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
  *in_stack_fffffffffffffe08;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
  *in_stack_fffffffffffffe10;
  numeric *in_stack_fffffffffffffe18;
  string local_1a0 [16];
  any *in_stack_fffffffffffffe70;
  allocator local_179;
  string local_178 [24];
  any *in_stack_fffffffffffffea0;
  int local_13c;
  numeric local_138;
  undefined1 local_110 [16];
  flat_hash_map<cs_impl::any,_cs_impl::any,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
  *local_100;
  undefined1 local_f2;
  allocator local_f1;
  string local_f0 [32];
  size_type local_d0;
  numeric local_c8;
  int local_9c;
  numeric local_98;
  long local_78;
  int local_6c;
  ulong local_68;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *local_60;
  undefined1 local_55;
  allocator local_41;
  string local_40 [56];
  reference local_8;
  
  cs_impl::any::type((any *)in_stack_fffffffffffffdf0);
  bVar2 = std::type_info::operator==
                    ((type_info *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  if (bVar2) {
    cs_impl::any::type((any *)in_stack_fffffffffffffdf0);
    bVar2 = std::type_info::operator!=
                      ((type_info *)in_stack_fffffffffffffdf0,(type_info *)in_stack_fffffffffffffde8
                      );
    if (bVar2) {
      local_55 = 1;
      uVar8 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_40,"Index must be a numeric.",&local_41);
      runtime_error::runtime_error(in_stack_fffffffffffffdf0,(string *)in_stack_fffffffffffffde8);
      local_55 = 0;
      __cxa_throw(uVar8,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
    local_60 = cs_impl::any::val<std::deque<cs_impl::any,std::allocator<cs_impl::any>>>
                         (in_stack_fffffffffffffea0);
    local_68 = 0;
    pnVar3 = cs_impl::any::const_val<cs::numeric>(in_stack_fffffffffffffe70);
    local_6c = 0;
    bVar2 = numeric::operator>=(pnVar3,&local_6c);
    if (bVar2) {
      pnVar3 = cs_impl::any::const_val<cs::numeric>(in_stack_fffffffffffffe70);
      uVar4 = numeric::as_integer(pnVar3);
      local_68 = uVar4;
      sVar5 = std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::size
                        ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)0x51099c);
      uVar1 = local_68;
      if (sVar5 <= uVar4) {
        sVar5 = std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::size
                          ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)0x5109c7);
        for (local_78 = (uVar1 - sVar5) + 1; local_78 != 0; local_78 = local_78 + -1) {
          local_9c = 0;
          numeric::numeric<int>(&local_98,&local_9c);
          std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::emplace_back<cs::numeric>
                    ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)in_stack_fffffffffffffdf0
                     ,in_stack_fffffffffffffde8);
        }
      }
    }
    else {
      cs_impl::any::const_val<cs::numeric>(in_stack_fffffffffffffe70);
      numeric::operator-(in_stack_fffffffffffffe18);
      local_d0 = std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::size
                           ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)0x510a6f);
      bVar2 = numeric::operator>(&local_c8,&local_d0);
      if (bVar2) {
        local_f2 = 1;
        uVar8 = __cxa_allocate_exception(0x28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_f0,"Out of range.",&local_f1);
        runtime_error::runtime_error(in_stack_fffffffffffffdf0,(string *)in_stack_fffffffffffffde8);
        local_f2 = 0;
        __cxa_throw(uVar8,&runtime_error::typeinfo,runtime_error::~runtime_error);
      }
      sVar5 = std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::size
                        ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)0x510b7c);
      pnVar3 = cs_impl::any::const_val<cs::numeric>(in_stack_fffffffffffffe70);
      nVar6 = numeric::as_integer(pnVar3);
      local_68 = sVar5 + nVar6;
    }
    local_8 = std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::operator[]
                        ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)
                         in_stack_fffffffffffffdf0,(size_type)in_stack_fffffffffffffde8);
  }
  else {
    cs_impl::any::type((any *)in_stack_fffffffffffffdf0);
    bVar2 = std::type_info::operator==
                      ((type_info *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    if (!bVar2) {
      cs_impl::any::type((any *)in_stack_fffffffffffffdf0);
      bVar2 = std::type_info::operator==
                        ((type_info *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      if (bVar2) {
        uVar8 = __cxa_allocate_exception(0x28);
        paVar9 = &local_179;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_178,"Access string object as lvalue.",paVar9);
        runtime_error::runtime_error(in_stack_fffffffffffffdf0,(string *)in_stack_fffffffffffffde8);
        __cxa_throw(uVar8,&runtime_error::typeinfo,runtime_error::~runtime_error);
      }
      str = (string *)__cxa_allocate_exception(0x28);
      this_00 = (runtime_error *)&stack0xfffffffffffffe5f;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1a0,"Access non-array or string object.",(allocator *)this_00);
      runtime_error::runtime_error(this_00,str);
      __cxa_throw(str,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
    local_100 = cs_impl::any::
                val<phmap::flat_hash_map<cs_impl::any,cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>>
                          (in_stack_fffffffffffffea0);
    sVar7 = phmap::priv::
            raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
            ::count<cs_impl::any>
                      (in_stack_fffffffffffffe10,(key_arg<cs_impl::any> *)in_stack_fffffffffffffe08)
    ;
    if (sVar7 == 0) {
      in_stack_fffffffffffffe10 =
           (raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
            *)local_110;
      in_stack_fffffffffffffe08 = local_100;
      cs_impl::any::any((any *)in_stack_fffffffffffffdf0,(any *)in_stack_fffffffffffffde8);
      copy((EVP_PKEY_CTX *)(local_110 + 8),(EVP_PKEY_CTX *)in_stack_fffffffffffffe10);
      local_13c = 0;
      numeric::numeric<int>(&local_138,&local_13c);
      phmap::priv::
      raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
      ::emplace<cs_impl::any,_cs::numeric,_0>
                (in_stack_fffffffffffffe00,(any *)in_stack_fffffffffffffdf8,
                 (numeric *)in_stack_fffffffffffffdf0);
      cs_impl::any::~any((any *)0x510cb2);
      cs_impl::any::~any((any *)0x510cbf);
    }
    local_8 = phmap::priv::
              raw_hash_map<phmap::priv::FlatHashMapPolicy<cs_impl::any,cs_impl::any>,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>
              ::at<cs_impl::any,phmap::priv::FlatHashMapPolicy<cs_impl::any,cs_impl::any>>
                        ((raw_hash_map<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
                          *)in_stack_fffffffffffffe10,
                         (key_arg<cs_impl::any> *)in_stack_fffffffffffffe08);
  }
  return local_8;
}

Assistant:

var &runtime_type::parse_access_lhs(const var &a, const var &b)
	{
		if (a.type() == typeid(array)) {
			if (b.type() != typeid(numeric))
				throw runtime_error("Index must be a numeric.");
			auto &arr = a.val<array>();
			std::size_t posit = 0;
			if (b.const_val<numeric>() >= 0) {
				posit = b.const_val<numeric>().as_integer();
				if (posit >= arr.size()) {
					for (std::size_t i = posit - arr.size() + 1; i > 0; --i)
						arr.emplace_back(numeric(0));
				}
			}
			else {
				if (-b.const_val<numeric>() > arr.size())
					throw runtime_error("Out of range.");
				posit = arr.size() + b.const_val<numeric>().as_integer();
			}
			return arr[posit];
		}
		else if (a.type() == typeid(hash_map)) {
			auto &map = a.val<hash_map>();
			if (map.count(b) == 0)
				map.emplace(copy(b), numeric(0));
			return map.at(b);
		}
		else if (a.type() == typeid(string))
			throw runtime_error("Access string object as lvalue.");
		else
			throw runtime_error("Access non-array or string object.");
	}